

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_setmetatable(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  uint uVar2;
  TRef TVar3;
  undefined8 *in_RSI;
  long in_RDI;
  RecordIndex ix;
  TRef mtref;
  TRef fref;
  TRef mt;
  TRef tr;
  uint local_cc;
  undefined4 uVar4;
  IRType t;
  jit_State *in_stack_ffffffffffffff40;
  
  uVar1 = **(uint **)(in_RDI + 0x88);
  uVar2 = *(uint *)(*(long *)(in_RDI + 0x88) + 4);
  if (((uVar1 & 0x1f000000) == 0xb000000) &&
     (((uVar2 & 0x1f000000) == 0xb000000 || ((uVar2 != 0 && ((uVar2 & 0x1f000000) == 0)))))) {
    t = (IRType)((ulong)*(undefined8 *)*in_RSI >> 0x20);
    uVar4 = (undefined4)*(undefined8 *)*in_RSI;
    lj_record_mm_lookup((jit_State *)"copy of dead GC object",*(RecordIndex **)(in_RDI + 0x68),
                        (MMS)((ulong)&stack0xffffffffffffff38 >> 0x20));
    *(undefined2 *)(in_RDI + 0xa4) = 0x3e05;
    *(short *)(in_RDI + 0xa0) = (short)uVar1;
    *(undefined2 *)(in_RDI + 0xa2) = 5;
    TVar3 = lj_opt_fold((jit_State *)CONCAT44(t,uVar4));
    local_cc = uVar2;
    if ((uVar2 & 0x1f000000) == 0) {
      local_cc = lj_ir_knull(in_stack_ffffffffffffff40,t);
    }
    *(undefined2 *)(in_RDI + 0xa4) = 0x4b0b;
    *(short *)(in_RDI + 0xa0) = (short)TVar3;
    *(short *)(in_RDI + 0xa2) = (short)local_cc;
    lj_opt_fold((jit_State *)CONCAT44(t,uVar4));
    if ((uVar2 & 0x1f000000) != 0) {
      *(undefined2 *)(in_RDI + 0xa4) = 0x560b;
      *(short *)(in_RDI + 0xa0) = (short)uVar1;
      *(undefined2 *)(in_RDI + 0xa2) = 0;
      lj_opt_fold((jit_State *)CONCAT44(t,uVar4));
    }
    **(uint **)(in_RDI + 0x88) = uVar1;
    *(undefined1 *)(in_RDI + 0x9d) = 1;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_setmetatable(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  TRef mt = J->base[1];
  if (tref_istab(tr) && (tref_istab(mt) || (mt && tref_isnil(mt)))) {
    TRef fref, mtref;
    RecordIndex ix;
    ix.tab = tr;
    copyTV(J->L, &ix.tabv, &rd->argv[0]);
    lj_record_mm_lookup(J, &ix, MM_metatable); /* Guard for no __metatable. */
    fref = emitir(IRT(IR_FREF, IRT_PGC), tr, IRFL_TAB_META);
    mtref = tref_isnil(mt) ? lj_ir_knull(J, IRT_TAB) : mt;
    emitir(IRT(IR_FSTORE, IRT_TAB), fref, mtref);
    if (!tref_isnil(mt))
      emitir(IRT(IR_TBAR, IRT_TAB), tr, 0);
    J->base[0] = tr;
    J->needsnap = 1;
  }  /* else: Interpreter will throw. */
}